

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.c
# Opt level: O2

void * object_getIndexedIvars(id obj)

{
  uintptr_t addr;
  ulong uVar1;
  Class poVar2;
  
  if (obj != (id)0x0) {
    if (((ulong)obj & 7) == 0) {
      poVar2 = obj->isa;
    }
    else {
      poVar2 = SmallObjectClasses[(ulong)obj & 7];
    }
    uVar1 = poVar2->instance_size;
    if (uVar1 == 0) {
      uVar1 = (ulong)(-((uint)poVar2->info & 1) & 0x88);
    }
    return (void *)((long)&obj->isa + uVar1);
  }
  return (void *)0x0;
}

Assistant:

void *object_getIndexedIvars(id obj)
{
	CHECK_ARG(obj);
	size_t size = classForObject(obj)->instance_size;
	if ((0 == size) && class_isMetaClass(classForObject(obj)))
	{
		size = sizeof(struct objc_class);
	}
	return ((char*)obj) + size;
}